

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O1

void bus0_sock_recv(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  nni_lmq *lmq;
  _Bool _Var1;
  size_t count;
  nni_msg *local_38;
  nni_msg *msg;
  
  mtx = (nni_mtx *)((long)arg + 0x18);
  nni_mtx_lock(mtx);
  lmq = (nni_lmq *)((long)arg + 0x60);
  do {
    _Var1 = nni_lmq_empty(lmq);
    if (_Var1) {
      _Var1 = nni_aio_start(aio,bus0_recv_cancel,arg);
      if (_Var1) {
        nni_list_append((nni_list *)((long)arg + 0xa8),aio);
      }
      nni_mtx_unlock(mtx);
      return;
    }
    nni_lmq_get(lmq,&local_38);
    _Var1 = nni_lmq_empty(lmq);
    if (_Var1) {
      nni_pollable_clear((nni_pollable *)((long)arg + 0x50));
    }
    local_38 = nni_msg_unique(local_38);
  } while (local_38 == (nni_msg *)0x0);
  nni_aio_set_msg(aio,local_38);
  nni_mtx_unlock(mtx);
  count = nni_msg_len(local_38);
  nni_aio_finish(aio,NNG_OK,count);
  return;
}

Assistant:

static void
bus0_sock_recv(void *arg, nni_aio *aio)
{
	bus0_sock *s = arg;
	nni_msg   *msg;

	nni_mtx_lock(&s->mtx);
again:
	if (nni_lmq_empty(&s->recv_msgs)) {
		if (!nni_aio_start(aio, bus0_recv_cancel, s)) {
			nni_mtx_unlock(&s->mtx);
			return;
		}
		nni_list_append(&s->recv_wait, aio);
		nni_mtx_unlock(&s->mtx);
		return;
	}

	(void) nni_lmq_get(&s->recv_msgs, &msg);

	if (nni_lmq_empty(&s->recv_msgs)) {
		nni_pollable_clear(&s->can_recv);
	}
	if ((msg = nni_msg_unique(msg)) == NULL) {
		goto again;
	}
	nni_aio_set_msg(aio, msg);
	nni_mtx_unlock(&s->mtx);
	nni_aio_finish(aio, 0, nni_msg_len(msg));
}